

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

int Abc_NodeBalanceCone_rec
              (Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst,int fDuplicate,int fSelective)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  void **ppvVar6;
  long lVar7;
  
  if ((*(byte *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0x20) != 0) {
    lVar5 = (long)vSuper->nSize;
    if (0 < lVar5) {
      lVar7 = 0;
      do {
        if ((Abc_Obj_t *)vSuper->pArray[lVar7] == pNode) {
          return 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar5 != lVar7);
    }
    if (0 < vSuper->nSize) {
      lVar7 = 0;
      do {
        if (vSuper->pArray[lVar7] == (void *)((ulong)pNode ^ 1)) {
          return -1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar5 != lVar7);
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                  ,0x167,"int Abc_NodeBalanceCone_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
  }
  if ((fFirst != 0) ||
     ((((((ulong)pNode & 1) == 0 && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
       ((fSelective != 0 || fDuplicate != 0 || ((pNode->vFanouts).nSize < 2)))) &&
      (vSuper->nSize < 0x2711)))) {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x171,"int Abc_NodeBalanceCone_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x172,"int Abc_NodeBalanceCone_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
    }
    iVar3 = Abc_NodeBalanceCone_rec
                      ((Abc_Obj_t *)
                       ((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^
                       (ulong)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]),vSuper,0,
                       fDuplicate,fSelective);
    iVar4 = Abc_NodeBalanceCone_rec
                      ((Abc_Obj_t *)
                       ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
                       (ulong)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]),vSuper,0,
                       fDuplicate,fSelective);
    if (iVar3 == -1) {
      return -1;
    }
    if (iVar4 == -1) {
      return -1;
    }
    return (uint)(iVar3 != 0 || iVar4 != 0);
  }
  uVar2 = vSuper->nCap;
  if (vSuper->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar6;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar2 * 2;
      if (iVar3 <= (int)uVar2) goto LAB_00297880;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
      vSuper->pArray = ppvVar6;
    }
    vSuper->nCap = iVar3;
  }
LAB_00297880:
  iVar3 = vSuper->nSize;
  vSuper->nSize = iVar3 + 1;
  vSuper->pArray[iVar3] = pNode;
  pbVar1 = (byte *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14);
  *pbVar1 = *pbVar1 | 0x20;
  return 0;
}

Assistant:

int Abc_NodeBalanceCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst, int fDuplicate, int fSelective )
{
    int RetValue1, RetValue2, i;
    // check if the node is visited
    if ( Abc_ObjRegular(pNode)->fMarkB )
    {
        // check if the node occurs in the same polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == pNode )
                return 1;
        // check if the node is present in the opposite polarity
        for ( i = 0; i < vSuper->nSize; i++ )
            if ( vSuper->pArray[i] == Abc_ObjNot(pNode) )
                return -1;
        assert( 0 );
        return 0;
    }
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst && (Abc_ObjIsComplement(pNode) || !Abc_ObjIsNode(pNode) || (!fDuplicate && !fSelective && (Abc_ObjFanoutNum(pNode) > 1)) || Vec_PtrSize(vSuper) > 10000) )
    {
        Vec_PtrPush( vSuper, pNode );
        Abc_ObjRegular(pNode)->fMarkB = 1;
        return 0;
    }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    // go through the branches
    RetValue1 = Abc_NodeBalanceCone_rec( Abc_ObjChild0(pNode), vSuper, 0, fDuplicate, fSelective );
    RetValue2 = Abc_NodeBalanceCone_rec( Abc_ObjChild1(pNode), vSuper, 0, fDuplicate, fSelective );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}